

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long in_RSI;
  int in_EDI;
  char **in_stack_00000318;
  int in_stack_00000320;
  char **in_stack_00000328;
  int in_stack_00000330;
  char **in_stack_00000588;
  int in_stack_00000590;
  char **in_stack_00000598;
  int in_stack_000005a0;
  char **in_stack_00001b58;
  int in_stack_00001b60;
  int local_4;
  
  if (in_EDI < 2) {
    anon_unknown.dwarf_26820::show_usage((ostream *)0x1495f8);
    local_4 = 1;
  }
  else {
    switch(**(undefined1 **)(in_RSI + 8)) {
    case 0x31:
      local_4 = anon_unknown.dwarf_26820::run_insertion(in_stack_000005a0,in_stack_00000598);
      break;
    case 0x32:
      local_4 = anon_unknown.dwarf_26820::run_deletion(in_stack_00000590,in_stack_00000588);
      break;
    case 0x33:
      local_4 = anon_unknown.dwarf_26820::run_search(in_stack_00000320,in_stack_00000318);
      break;
    case 0x34:
      local_4 = anon_unknown.dwarf_26820::run_rearrangement(in_stack_00000330,in_stack_00000328);
      break;
    case 0x35:
      local_4 = anon_unknown.dwarf_26820::generate_keys(in_stack_00001b60,in_stack_00001b58);
      break;
    default:
      anon_unknown.dwarf_26820::show_usage((ostream *)0x1496a3);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc < 2) {
    show_usage(std::cerr);
    return 1;
  }

  switch (*argv[1]) {
    case '1':
      return run_insertion(argc, argv);
    case '2':
      return run_deletion(argc, argv);
    case '3':
      return run_search(argc, argv);
    case '4':
      return run_rearrangement(argc, argv);
    case '5':
      return generate_keys(argc, argv);
    default:
      show_usage(std::cerr);
      break;
  }

  return 1;
}